

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_30;
  Voidify local_19;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CopyingInputStreamAdaptor *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(this->backup_bytes_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_18 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"backup_bytes_ == 0");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x11a,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  this->buffer_used_ = 0;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::reset
            (&this->buffer_,(nullptr_t)0x0);
  return;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  ABSL_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}